

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_soi(j_decompress_ptr cinfo)

{
  int local_14;
  int i;
  j_decompress_ptr cinfo_local;
  
  cinfo->err->msg_code = 0x68;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  if (cinfo->marker->saw_SOI != 0) {
    cinfo->err->msg_code = 0x3f;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    cinfo->arith_dc_L[local_14] = '\0';
    cinfo->arith_dc_U[local_14] = '\x01';
    cinfo->arith_ac_K[local_14] = '\x05';
  }
  cinfo->restart_interval = 0;
  cinfo->jpeg_color_space = JCS_UNKNOWN;
  cinfo->CCIR601_sampling = 0;
  cinfo->saw_JFIF_marker = 0;
  cinfo->JFIF_major_version = '\x01';
  cinfo->JFIF_minor_version = '\x01';
  cinfo->density_unit = '\0';
  cinfo->X_density = 1;
  cinfo->Y_density = 1;
  cinfo->saw_Adobe_marker = 0;
  cinfo->Adobe_transform = '\0';
  cinfo->marker->saw_SOI = 1;
  return 1;
}

Assistant:

LOCAL(boolean)
get_soi (j_decompress_ptr cinfo)
/* Process an SOI marker */
{
  int i;
  
  TRACEMS(cinfo, 1, JTRC_SOI);

  if (cinfo->marker->saw_SOI)
    ERREXIT(cinfo, JERR_SOI_DUPLICATE);

  /* Reset all parameters that are defined to be reset by SOI */

  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    cinfo->arith_dc_L[i] = 0;
    cinfo->arith_dc_U[i] = 1;
    cinfo->arith_ac_K[i] = 5;
  }
  cinfo->restart_interval = 0;

  /* Set initial assumptions for colorspace etc */

  cinfo->jpeg_color_space = JCS_UNKNOWN;
  cinfo->CCIR601_sampling = FALSE; /* Assume non-CCIR sampling??? */

  cinfo->saw_JFIF_marker = FALSE;
  cinfo->JFIF_major_version = 1; /* set default JFIF APP0 values */
  cinfo->JFIF_minor_version = 1;
  cinfo->density_unit = 0;
  cinfo->X_density = 1;
  cinfo->Y_density = 1;
  cinfo->saw_Adobe_marker = FALSE;
  cinfo->Adobe_transform = 0;

  cinfo->marker->saw_SOI = TRUE;

  return TRUE;
}